

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall
QO_Manager::ApplyEQCond
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,int condIdx,float *numTuples)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  float *pfVar3;
  float fVar4;
  float local_44;
  float local_40;
  float value;
  float frac;
  int attrIdx2;
  int attrIdx;
  RC rc;
  float *numTuples_local;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> *pmStack_20;
  int condIdx_local;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
  *attr_stats_local;
  QO_Manager *this_local;
  
  attrIdx2 = 0;
  _attrIdx = numTuples;
  numTuples_local._4_4_ = condIdx;
  pmStack_20 = attr_stats;
  attr_stats_local =
       (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> *)this;
  attrIdx2 = CondToAttrIdx(this,condIdx,(int *)&frac,(int *)&value);
  this_local._4_4_ = attrIdx2;
  if (attrIdx2 == 0) {
    local_40 = 0.0;
    if (this->conds[numTuples_local._4_4_].bRhsIsAttr == 0) {
      ConvertValueToFloat(this,numTuples_local._4_4_,&local_44);
      fVar4 = *_attrIdx;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar4 = ceilf(fVar4 / pmVar1->numTuples);
      *_attrIdx = fVar4;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar4 = local_44;
      pmVar1->numTuples = 1.0;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar1->minValue = fVar4;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar1->maxValue = local_44;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      local_40 = pmVar1->numTuples;
    }
    else {
      fVar4 = *_attrIdx;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&value);
      pfVar3 = std::max<float>(&pmVar1->numTuples,&pmVar2->numTuples);
      *_attrIdx = fVar4 / *pfVar3;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&value);
      pfVar3 = std::max<float>(&pmVar1->numTuples,&pmVar2->numTuples);
      fVar4 = *pfVar3;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar1->numTuples = fVar4;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&value);
      pfVar3 = std::max<float>(&pmVar1->numTuples,&pmVar2->numTuples);
      fVar4 = *pfVar3;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&value);
      pmVar1->numTuples = fVar4;
      pmVar1 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&value);
      pfVar3 = std::max<float>(&pmVar1->numTuples,&pmVar2->numTuples);
      local_40 = *pfVar3;
    }
    local_40 = 1.0 / local_40;
    NormalizeStats(this,pmStack_20,local_40,*_attrIdx,(int)frac,(int)value);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QO_Manager::ApplyEQCond(map<int, attrStat> &attr_stats, int condIdx, float& numTuples){
  RC rc = 0;
  // Retrieves the indices of the condition attributes
  int attrIdx, attrIdx2;
  if((rc = CondToAttrIdx(condIdx, attrIdx, attrIdx2)))
    return (rc);
  float frac = 0.0;
  if(conds[condIdx].bRhsIsAttr){
    // assume containment of value sets
    numTuples = numTuples / max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
    attr_stats[attrIdx].numTuples = max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
    attr_stats[attrIdx2].numTuples = max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
    frac = 1.0/max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
  }
  else{
    // calculate the # of tuples
    float value;
    ConvertValueToFloat(condIdx, value);
    numTuples = ceilf(numTuples / attr_stats[attrIdx].numTuples);
    attr_stats[attrIdx].numTuples = 1;
    attr_stats[attrIdx].minValue = value;
    attr_stats[attrIdx].maxValue = value;
    frac = 1.0/attr_stats[attrIdx].numTuples;
  }
  // Normalize non-join attributes
  NormalizeStats(attr_stats, frac, numTuples, attrIdx, attrIdx2);
  return (0);
}